

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void * Node_AddData(node *Node,dataid Id,datatype Type,void *Data)

{
  undefined8 *puVar1;
  size_t __n;
  nodedata *pnVar2;
  nodecontext *p;
  nodedata *Ptr;
  size_t Size;
  void *Data_local;
  datatype Type_local;
  dataid Id_local;
  node *Node_local;
  
  if ((Node == (node *)0x0) || (__n = Node_DataSize(Node,Id,Type & 0x3f,Data,0x2a), __n == 0)) {
    Node_local = (node *)0x0;
  }
  else {
    if (Node == (node *)0x0) {
      __assert_fail("(const void*)(Node)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x20a,"void *Node_AddData(node *, dataid, datatype, const void *)");
    }
    puVar1 = *(undefined8 **)(*Node->VMT + 0x80);
    pnVar2 = (nodedata *)(*(code *)*puVar1)(puVar1,__n + 0x10);
    if (pnVar2 == (nodedata *)0x0) {
      Node_local = (node *)0x0;
    }
    else {
      memcpy(pnVar2 + 1,Data,__n);
      pnVar2->Code = Id << 8 | Type;
      pnVar2->Next = Node->Data;
      Node->Data = pnVar2;
      if ((Type == 0x17) && (pnVar2[1].Next != (nodedata *)0x0)) {
        Node_AddRef(pnVar2[1].Next);
      }
      Node_local = (node *)(pnVar2 + 1);
    }
  }
  return Node_local;
}

Assistant:

NOINLINE void* Node_AddData(node* Node, dataid Id, datatype Type, const void* Data)
{
    if (Node)
    {
        size_t Size = Node_DataSize(Node,Id,Type&TYPE_MASK,Data,META_PARAM_UNSET); // META_PARAM_UNSET is neutral for the type
        if (Size>0)
        {
            nodedata* Ptr;
            nodecontext* p = Node_Context(Node);

            Ptr = (nodedata*)MemHeap_Alloc(p->NodeHeap,sizeof(nodedata)+Size);
            if (!Ptr)
            {
                return NULL;
            }

            // Data list order is important. Evaluating TYPE_EXPRSTRING needs to be done in the order it was added
            // This function reverses the order, but we also use Node_Copy with templates so the final order it correct (hackish...)

            memcpy(NodeData_Data(Ptr),Data,Size);
            Ptr->Code = (Id<<DYNDATA_SHIFT)|Type;
            Ptr->Next = Node->Data;
            Node->Data = Ptr;

            if (Type == TYPE_NODE_REF && *(node**)NodeData_Data(Ptr))
                Node_AddRef(*(node**)NodeData_Data(Ptr));

            return NodeData_Data(Ptr);
        }
    }
    return NULL;
}